

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddXcFrameworkItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmListFileBacktrace *bt;
  __type _Var1;
  bool bVar2;
  int iVar3;
  cmXcFrameworkPlistLibrary *args;
  string libraryPath;
  LinkEntry libraryEntry;
  optional<cmXcFrameworkPlist> plist;
  allocator<char> local_185;
  ItemIsPath local_184;
  string local_180;
  FeatureDescriptor *local_160;
  string local_158;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  LinkEntry local_108;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a0;
  _Optional_payload_base<cmXcFrameworkPlist> local_70;
  
  bt = &(entry->Item).Backtrace;
  cmParseXcFrameworkPlist
            ((optional<cmXcFrameworkPlist> *)&local_70,(string *)entry,this->Makefile,bt);
  if (local_70._M_engaged != true) goto LAB_00371cf0;
  args = cmXcFrameworkPlist::SelectSuitableLibrary
                   ((cmXcFrameworkPlist *)&local_70,this->Makefile,bt);
  if (args == (cmXcFrameworkPlistLibrary *)0x0) goto LAB_00371cf0;
  iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
  if ((char)iVar3 != '\0') {
    local_180._M_dataplus._M_p = (pointer)0x0;
    local_158._M_dataplus._M_p = (pointer)0x0;
    local_184 = Yes;
    _Var1 = std::operator==(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
    if (_Var1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"__CMAKE_LINK_XCFRAMEWORK",&local_185);
    }
    else {
      std::__cxx11::string::string((string *)&local_108,(string *)&entry->Feature);
    }
    local_160 = FindLibraryFeature(this,(string *)&local_108);
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string_const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry,
               &local_184,(void **)&local_180,(void **)&local_158,&local_160);
    std::__cxx11::string::~string((string *)&local_108);
    goto LAB_00371cf0;
  }
  local_108.Item.Value._M_dataplus._M_p._0_1_ = 0x2f;
  local_158._M_dataplus._M_p._0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char,std::__cxx11::string_const&>
            (&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry,
             (char *)&local_108,&args->LibraryIdentifier,(char *)&local_158,&args->LibraryPath);
  std::__cxx11::string::string((string *)&local_128,(string *)&local_180);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_138,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)bt);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_a0,&local_128,(cmListFileBacktrace *)&local_138);
  cmComputeLinkDepends::LinkEntry::LinkEntry(&local_108,&local_a0,entry->Target);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  std::__cxx11::string::~string((string *)&local_128);
  bVar2 = cmSystemTools::IsPathToFramework(&local_180);
  if (bVar2) {
    bVar2 = cmGeneratorTarget::IsApple(this->Target);
    if (!bVar2) goto LAB_00371c10;
    AddFrameworkItem(this,&local_108);
  }
  else {
LAB_00371c10:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,&local_180);
    AddFullItem(this,&local_108);
    AddLibraryRuntimeInfo(this,&local_180);
    if ((args->HeadersPath)._M_string_length != 0) {
      local_160 = (FeatureDescriptor *)CONCAT71(local_160._1_7_,0x2f);
      local_184 = CONCAT31(local_184._1_3_,0x2f);
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry,
                 (char *)&local_160,&args->LibraryIdentifier,(char *)&local_184,&args->HeadersPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->XcFrameworkHeaderPaths,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
    }
  }
  cmComputeLinkDepends::LinkEntry::~LinkEntry(&local_108);
  std::__cxx11::string::~string((string *)&local_180);
LAB_00371cf0:
  std::_Optional_payload_base<cmXcFrameworkPlist>::_M_reset(&local_70);
  return;
}

Assistant:

void cmComputeLinkInformation::AddXcFrameworkItem(LinkEntry const& entry)
{
  auto plist = cmParseXcFrameworkPlist(entry.Item.Value, *this->Makefile,
                                       entry.Item.Backtrace);
  if (!plist) {
    return;
  }

  if (auto const* lib =
        plist->SelectSuitableLibrary(*this->Makefile, entry.Item.Backtrace)) {
    if (this->GlobalGenerator->IsXcode()) {
      this->Items.emplace_back(
        entry.Item.Value, ItemIsPath::Yes, nullptr, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_XCFRAMEWORK"
                                   : entry.Feature));
    } else {
      auto libraryPath = cmStrCat(
        entry.Item.Value, '/', lib->LibraryIdentifier, '/', lib->LibraryPath);
      LinkEntry libraryEntry(
        BT<std::string>(libraryPath, entry.Item.Backtrace), entry.Target);

      if (cmSystemTools::IsPathToFramework(libraryPath) &&
          this->Target->IsApple()) {
        // This is a framework.
        this->AddFrameworkItem(libraryEntry);
      } else {
        this->Depends.push_back(libraryPath);
        this->AddFullItem(libraryEntry);
        this->AddLibraryRuntimeInfo(libraryPath);
        if (!lib->HeadersPath.empty()) {
          this->AddXcFrameworkHeaderPath(cmStrCat(entry.Item.Value, '/',
                                                  lib->LibraryIdentifier, '/',
                                                  lib->HeadersPath));
        }
      }
    }
  }
}